

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QRenderRule * __thiscall QRenderRule::borderClip(QRenderRule *this,QRect r)

{
  int iVar1;
  undefined1 auVar2 [12];
  int iVar3;
  int iVar4;
  long lVar5;
  undefined8 in_RCX;
  long lVar6;
  QStyleSheetBorderData *pQVar7;
  QSharedDataPointer<QStyleSheetBorderData> *this_00;
  long in_FS_OFFSET;
  double dVar8;
  double dVar9;
  int iVar11;
  double dVar10;
  double dVar12;
  double dVar13;
  undefined8 uVar15;
  undefined1 auVar14 [16];
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  QSize local_78;
  QSize local_70;
  QSize local_68;
  QSize local_60;
  QRect local_58;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  long local_20;
  
  local_58._0_8_ = r._8_8_;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = *(QStyleSheetBorderData **)(r._0_8_ + 0x48);
  if (pQVar7 == (QStyleSheetBorderData *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QPainterPath::QPainterPath((QPainterPath *)this);
      return this;
    }
    goto LAB_00355b9c;
  }
  this_00 = (QSharedDataPointer<QStyleSheetBorderData> *)(r._0_8_ + 0x48);
  local_60.wd.m_i = -1;
  local_60.ht.m_i = -1;
  local_68.wd.m_i = -1;
  local_68.ht.m_i = -1;
  local_70.wd.m_i = -1;
  local_70.ht.m_i = -1;
  local_78.wd.m_i = -1;
  local_78.ht.m_i = -1;
  local_58._8_8_ = in_RCX;
  if ((pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i != 1) {
    QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
    pQVar7 = (this_00->d).ptr;
  }
  qNormalizeRadii(&local_58,pQVar7->radii,&local_60,&local_68,&local_70,&local_78);
  if (local_60.ht.m_i == 0 && local_60.wd.m_i == 0) {
    if (local_68.ht.m_i != 0 || local_68.wd.m_i != 0) goto LAB_003557b4;
    if (local_70.ht.m_i != 0 || local_70.wd.m_i != 0) goto LAB_003557b4;
    if (local_78.ht.m_i != 0 || local_78.wd.m_i != 0) goto LAB_003557b4;
    QPainterPath::QPainterPath((QPainterPath *)this);
  }
  else {
LAB_003557b4:
    lVar5 = (long)local_58.x1.m_i;
    dVar8 = (double)local_58.x1.m_i;
    lVar6 = (long)local_58.y1.m_i;
    dVar9 = (double)local_58.y1.m_i;
    pQVar7 = (this_00->d).ptr;
    *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)this);
    dVar12 = (double)pQVar7->borders[0] * 0.5 + dVar9;
    local_48 = (double)local_60.wd.m_i + dVar8;
    dStack_40 = dVar12;
    QPainterPath::moveTo((QPointF *)this);
    dVar13 = (double)((local_58.x2.m_i - lVar5) + 1) + dVar8;
    local_48 = dVar13 - (double)local_68.wd.m_i;
    dStack_40 = dVar12;
    QPainterPath::lineTo((QPointF *)this);
    iVar11 = (int)((ulong)*(undefined8 *)pQVar7->borders >> 0x20);
    local_48 = (double)iVar11;
    iVar1 = local_68.wd.m_i.m_i * 2;
    local_38 = (double)(iVar1 - iVar11);
    dStack_30 = (double)(local_68.ht.m_i.m_i * 2 - (int)*(undefined8 *)pQVar7->borders);
    dVar10 = (double)((local_58.y2.m_i - lVar6) + 1) + dVar9;
    dVar13 = dVar13 - local_48 * 0.5;
    local_48 = (dVar13 - (double)iVar1) + local_48;
    dStack_40 = dVar12;
    QPainterPath::arcTo((QRectF *)this,90.0,-90.0);
    dStack_40 = dVar10 - (double)local_78.ht.m_i;
    local_48 = dVar13;
    QPainterPath::lineTo((QPointF *)this);
    iVar1 = (int)*(undefined8 *)(pQVar7->borders + 1);
    iVar11 = (int)((ulong)*(undefined8 *)(pQVar7->borders + 1) >> 0x20);
    dStack_40 = (double)iVar11;
    dVar12 = dVar10 - dStack_40 * 0.5;
    iVar3 = local_78.wd.m_i.m_i * 2;
    iVar4 = local_78.ht.m_i.m_i * 2;
    local_48 = (dVar13 - (double)iVar3) + (double)iVar1;
    dStack_40 = (dVar12 - (double)iVar4) + dStack_40;
    local_38 = (double)(iVar3 - iVar1);
    dStack_30 = (double)(iVar4 - iVar11);
    QPainterPath::arcTo((QRectF *)this,0.0,-90.0);
    local_48 = (double)local_70.wd.m_i + dVar8;
    dStack_40 = dVar12;
    QPainterPath::lineTo((QPointF *)this);
    iVar1 = (int)*(undefined8 *)(pQVar7->borders + 2);
    iVar11 = (int)((ulong)*(undefined8 *)(pQVar7->borders + 2) >> 0x20);
    iVar3 = local_70.ht.m_i.m_i * 2;
    dVar10 = (dVar10 - (double)iVar3) + (double)iVar1 * 0.5;
    dVar8 = dVar8 + (double)iVar11 * 0.5;
    uVar15 = 0;
    local_38 = (double)(local_70.wd.m_i.m_i * 2 - iVar11);
    dStack_30 = (double)(iVar3 - iVar1);
    local_48 = dVar8;
    dStack_40 = dVar10;
    QPainterPath::arcTo((QRectF *)this,270.0,-90.0);
    dStack_40 = (double)local_60.ht.m_i + dVar9;
    QPainterPath::lineTo((QPointF *)this);
    dStack_40 = (double)pQVar7->borders[0] * 0.5 + dVar9;
    uStack_b4 = (undefined4)((ulong)dVar10 >> 0x20);
    uStack_b0 = SUB84(dVar8,0);
    uStack_ac = (undefined4)((ulong)dVar8 >> 0x20);
    auVar2._4_8_ = uVar15;
    auVar2._0_4_ = uStack_b4;
    auVar14._0_8_ = auVar2._0_8_ << 0x20;
    auVar14._8_4_ = uStack_b0;
    auVar14._12_4_ = uStack_ac;
    local_48 = auVar14._8_8_;
    local_38 = (double)(local_60.wd.m_i.m_i * 2 - pQVar7->borders[3]);
    dStack_30 = (double)(local_60.ht.m_i.m_i * 2 - pQVar7->borders[0]);
    QPainterPath::arcTo((QRectF *)this,180.0,-90.0);
    QPainterPath::closeSubpath();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
LAB_00355b9c:
  __stack_chk_fail();
}

Assistant:

QPainterPath QRenderRule::borderClip(QRect r)
{
    if (!hasBorder())
        return QPainterPath();

    QSize tlr, trr, blr, brr;
    qNormalizeRadii(r, bd->radii, &tlr, &trr, &blr, &brr);
    if (tlr.isNull() && trr.isNull() && blr.isNull() && brr.isNull())
        return QPainterPath();

    const QRectF rect(r);
    const int *borders = border()->borders;
    QPainterPath path;
    qreal curY = rect.y() + borders[TopEdge]/2.0;
    path.moveTo(rect.x() + tlr.width(), curY);
    path.lineTo(rect.right() - trr.width(), curY);
    qreal curX = rect.right() - borders[RightEdge]/2.0;
    path.arcTo(curX - 2*trr.width() + borders[RightEdge], curY,
               trr.width()*2 - borders[RightEdge], trr.height()*2 - borders[TopEdge], 90, -90);

    path.lineTo(curX, rect.bottom() - brr.height());
    curY = rect.bottom() - borders[BottomEdge]/2.0;
    path.arcTo(curX - 2*brr.width() + borders[RightEdge], curY - 2*brr.height() + borders[BottomEdge],
               brr.width()*2 - borders[RightEdge], brr.height()*2 - borders[BottomEdge], 0, -90);

    path.lineTo(rect.x() + blr.width(), curY);
    curX = rect.left() + borders[LeftEdge]/2.0;
    path.arcTo(curX, rect.bottom() - 2*blr.height() + borders[BottomEdge]/2.0,
               blr.width()*2 - borders[LeftEdge], blr.height()*2 - borders[BottomEdge], 270, -90);

    path.lineTo(curX, rect.top() + tlr.height());
    path.arcTo(curX, rect.top() + borders[TopEdge]/2.0,
               tlr.width()*2 - borders[LeftEdge], tlr.height()*2 - borders[TopEdge], 180, -90);

    path.closeSubpath();
    return path;
}